

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

void get_range<double>(size_t *ix_arr,double *x,size_t st,size_t end,MissingAction missing_action,
                      double *xmin,double *xmax,bool *unsplittable)

{
  double dVar1;
  bool bVar2;
  size_t row;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar5;
  double __x;
  undefined1 local_68 [16];
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  if (missing_action == Fail) {
    __x = -INFINITY;
    local_68._0_8_ = INFINITY;
    for (; st <= end; st = st + 1) {
      dVar1 = x[ix_arr[st]];
      uVar3 = SUB84(dVar1,0);
      uVar4 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar5 = dVar1;
      if ((double)local_68._0_8_ <= dVar1) {
        dVar5 = (double)local_68._0_8_;
      }
      *xmin = dVar5;
      if (dVar1 <= __x) {
        uVar3 = SUB84(__x,0);
        uVar4 = (undefined4)((ulong)__x >> 0x20);
      }
      *xmax = (double)CONCAT44(uVar4,uVar3);
      __x = (double)CONCAT44(uVar4,uVar3);
      local_68._0_8_ = dVar5;
    }
  }
  else {
    local_68 = ZEXT816(0x7ff0000000000000);
    __x = -INFINITY;
    for (; st <= end; st = st + 1) {
      dVar1 = x[ix_arr[st]];
      dVar5 = fmin((double)local_68._0_8_,dVar1);
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar5;
      local_68._12_4_ = extraout_XMM0_Dd;
      *xmin = dVar5;
      __x = fmax(__x,dVar1);
      *xmax = __x;
    }
  }
  bVar2 = true;
  if ((((double)local_68._0_8_ != __x) || (NAN((double)local_68._0_8_) || NAN(__x))) &&
     ((double)local_68._0_8_ != INFINITY || __x != -INFINITY)) {
    bVar2 = NAN(__x);
  }
  *unsplittable = bVar2;
  return;
}

Assistant:

void get_range(size_t ix_arr[], real_t *restrict x, size_t st, size_t end,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;
    double xval;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = (xval < xmin)? xval : xmin;
            xmax = (xval > xmax)? xval : xmax;
        }
    }


    else
    {
        for (size_t row = st; row <= end; row++)
        {
            xval = x[ix_arr[row]];
            xmin = std::fmin(xmin, xval);
            xmax = std::fmax(xmax, xval);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}